

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable,bool kotlin)

{
  string local_50;
  
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)descriptor,descriptor,immutable);
  GetClassFullName(__return_storage_ptr__,this,&local_50,*(FileDescriptor **)(descriptor + 0x10),
                   immutable,
                   *(bool *)(*(long *)(*(FileDescriptor **)(descriptor + 0x10) + 0x78) + 0x98),
                   kotlin);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                            bool immutable, bool kotlin) {
  return GetClassFullName(
      ClassNameWithoutPackage(descriptor, immutable), descriptor->file(),
      immutable, MultipleJavaFiles(descriptor->file(), immutable), kotlin);
}